

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tile_config_test.cc
# Opt level: O1

void __thiscall
(anonymous_namespace)::UniformTileConfigTestLarge_UniformTileConfigTest_Test::
~UniformTileConfigTestLarge_UniformTileConfigTest_Test
          (UniformTileConfigTestLarge_UniformTileConfigTest_Test *this)

{
  anon_unknown.dwarf_c8a567::UniformTileConfigTestLarge::~UniformTileConfigTestLarge
            ((UniformTileConfigTestLarge *)(this + -0x18));
  operator_delete((UniformTileConfigTestLarge *)(this + -0x18));
  return;
}

Assistant:

TEST_P(UniformTileConfigTestLarge, UniformTileConfigTest) {
  ::libaom_test::Y4mVideoSource video("niklas_1280_720_30.y4m", 0, 1);
  ASSERT_NO_FATAL_FAILURE(video.Begin());

  int max_tiles_cols = video.img()->w / (int)tile_config_param_.sb_size;
  int max_tiles_rows = video.img()->h / (int)tile_config_param_.sb_size;
  max_tile_cols_log2_ = tile_log2(1, AOMMIN(max_tiles_cols, AOM_MAX_TILE_COLS));
  max_tile_rows_log2_ = tile_log2(1, AOMMIN(max_tiles_rows, AOM_MAX_TILE_ROWS));

  ASSERT_NO_FATAL_FAILURE(RunLoop(&video));
  ASSERT_EQ(tile_config_violated_, false);
}